

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O2

int zip_resolve(PHYSFS_Io *io,ZIPinfo *info,ZIPentry *entry)

{
  ZipResolveType ZVar1;
  PHYSFS_ErrorCode errcode;
  int iVar2;
  ZipResolveType ZVar3;
  PHYSFS_uint16 ui16;
  PHYSFS_uint32 ui32;
  ushort local_24;
  PHYSFS_uint16 fnamelen;
  
  ZVar1 = entry->resolved;
  iVar2 = 1;
  switch(ZVar1) {
  case ZIP_RESOLVING:
    errcode = PHYSFS_ERR_SYMLINK_LOOP;
    break;
  case ZIP_RESOLVED:
  case ZIP_DIRECTORY:
    goto switchD_00115002_caseD_3;
  case ZIP_BROKEN_FILE:
  case ZIP_BROKEN_SYMLINK:
    errcode = PHYSFS_ERR_CORRUPT;
    break;
  default:
    if ((entry->tree).isdir != 0) {
      entry->resolved = ZIP_DIRECTORY;
      return 1;
    }
    iVar2 = (*io->seek)(io,entry->offset);
    if ((iVar2 == 0) || (iVar2 = readui32(io,&ui32), iVar2 == 0)) {
LAB_001151b8:
      iVar2 = 0;
      if (ZVar1 == ZIP_UNRESOLVED_SYMLINK) {
        ZVar3 = ZIP_BROKEN_SYMLINK;
      }
      else {
        ZVar3 = ZIP_BROKEN_FILE;
        iVar2 = 0;
LAB_001151c7:
        if (ZVar1 != ZIP_UNRESOLVED_FILE) {
          return iVar2;
        }
      }
    }
    else {
      if (ui32 != 0x4034b50) {
LAB_001151b0:
        PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
        goto LAB_001151b8;
      }
      iVar2 = readui16(io,&ui16);
      if (iVar2 == 0) goto LAB_001151b8;
      if (ui16 != entry->version_needed) goto LAB_001151b0;
      iVar2 = readui16(io,&ui16);
      if ((iVar2 == 0) || (iVar2 = readui16(io,&ui16), iVar2 == 0)) goto LAB_001151b8;
      if (ui16 != entry->compression_method) goto LAB_001151b0;
      iVar2 = readui32(io,&ui32);
      if ((iVar2 == 0) || (iVar2 = readui32(io,&ui32), iVar2 == 0)) goto LAB_001151b8;
      if ((ui32 != 0) && (ui32 != entry->crc)) goto LAB_001151b0;
      iVar2 = readui32(io,&ui32);
      if (iVar2 == 0) goto LAB_001151b8;
      if ((ui32 - 1 < 0xfffffffe) && (entry->compressed_size != (ulong)ui32)) goto LAB_001151b0;
      iVar2 = readui32(io,&ui32);
      if (iVar2 == 0) goto LAB_001151b8;
      if ((ui32 - 1 < 0xfffffffe) && (entry->uncompressed_size != (ulong)ui32)) goto LAB_001151b0;
      iVar2 = readui16(io,&fnamelen);
      if ((iVar2 == 0) || (iVar2 = readui16(io,&local_24), iVar2 == 0)) goto LAB_001151b8;
      entry->offset = entry->offset + (ulong)local_24 + (ulong)fnamelen + 0x1e;
      if (ZVar1 != ZIP_UNRESOLVED_SYMLINK) {
        ZVar3 = ZIP_RESOLVED;
        iVar2 = 1;
        goto LAB_001151c7;
      }
      iVar2 = zip_resolve_symlink(io,info,entry);
      ZVar3 = (uint)(iVar2 == 0) * 3 + ZIP_RESOLVED;
    }
    entry->resolved = ZVar3;
    goto switchD_00115002_caseD_3;
  }
  PHYSFS_setErrorCode(errcode);
  iVar2 = 0;
switchD_00115002_caseD_3:
  return iVar2;
}

Assistant:

static int zip_resolve(PHYSFS_Io *io, ZIPinfo *info, ZIPentry *entry)
{
    int retval = 1;
    const ZipResolveType resolve_type = entry->resolved;

    if (resolve_type == ZIP_DIRECTORY)
        return 1;   /* we're good. */

    /* Don't bother if we've failed to resolve this entry before. */
    BAIL_IF(resolve_type == ZIP_BROKEN_FILE, PHYSFS_ERR_CORRUPT, 0);
    BAIL_IF(resolve_type == ZIP_BROKEN_SYMLINK, PHYSFS_ERR_CORRUPT, 0);

    /* uhoh...infinite symlink loop! */
    BAIL_IF(resolve_type == ZIP_RESOLVING, PHYSFS_ERR_SYMLINK_LOOP, 0);

    /*
     * We fix up the offset to point to the actual data on the
     *  first open, since we don't want to seek across the whole file on
     *  archive open (can be SLOW on large, CD-stored files), but we
     *  need to check the local file header...not just for corruption,
     *  but since it stores offset info the central directory does not.
     */
    if (resolve_type != ZIP_RESOLVED)
    {
        if (entry->tree.isdir)  /* an ancestor dir that DirTree filled in? */
        {
            entry->resolved = ZIP_DIRECTORY;
            return 1;
        } /* if */

        retval = zip_parse_local(io, entry);
        if (retval)
        {
            /*
             * If it's a symlink, find the original file. This will cause
             *  resolution of other entries (other symlinks and, eventually,
             *  the real file) if all goes well.
             */
            if (resolve_type == ZIP_UNRESOLVED_SYMLINK)
                retval = zip_resolve_symlink(io, info, entry);
        } /* if */

        if (resolve_type == ZIP_UNRESOLVED_SYMLINK)
            entry->resolved = ((retval) ? ZIP_RESOLVED : ZIP_BROKEN_SYMLINK);
        else if (resolve_type == ZIP_UNRESOLVED_FILE)
            entry->resolved = ((retval) ? ZIP_RESOLVED : ZIP_BROKEN_FILE);
    } /* if */

    return retval;
}